

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

bool __thiscall
llvm::yaml::document_iterator::operator==(document_iterator *this,document_iterator *Other)

{
  bool bVar1;
  bool local_29;
  document_iterator *Other_local;
  document_iterator *this_local;
  
  bVar1 = isAtEnd(this);
  if ((bVar1) || (bVar1 = isAtEnd(Other), bVar1)) {
    bVar1 = isAtEnd(this);
    local_29 = false;
    if (bVar1) {
      local_29 = isAtEnd(Other);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = this->Doc == Other->Doc;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const document_iterator &Other) const {
    if (isAtEnd() || Other.isAtEnd())
      return isAtEnd() && Other.isAtEnd();

    return Doc == Other.Doc;
  }